

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

wchar_t scan_unicode_pattern
                  (char *out,wchar_t *wout,char *u16be,char *u16le,char *pattern,wchar_t mac_nfd)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t local_64;
  char *pcStack_60;
  wchar_t ret;
  char *op16le;
  char *op16be;
  wchar_t *owp;
  char *op;
  char *p;
  uint uc;
  wchar_t mac_nfd_local;
  char *pattern_local;
  char *u16le_local;
  char *u16be_local;
  wchar_t *wout_local;
  char *out_local;
  
  p._0_4_ = 0;
  local_64 = L'\0';
  pcStack_60 = u16le;
  op16le = u16be;
  op16be = (char *)wout;
  owp = (wchar_t *)out;
  op = pattern;
  do {
    if ((*op < '0') || ('9' < *op)) {
      if ((*op < 'A') || ('F' < *op)) {
        if (((mac_nfd != L'\0') && (owp == (wchar_t *)out)) &&
           ((((((uint32_t)p == 0x2194 ||
               (((((((uint32_t)p - 0x219a < 2 || ((uint32_t)p == 0x21ae)) ||
                   ((uint32_t)p - 0x21cd < 3)) ||
                  (((uint32_t)p == 0x2204 || ((uint32_t)p == 0x2209)))) || ((uint32_t)p == 0x220c))
                || ((((uint32_t)p == 0x2224 || ((uint32_t)p == 0x2226)) ||
                    (((uint32_t)p == 0x2241 ||
                     ((((uint32_t)p == 0x2244 || ((uint32_t)p == 0x2247)) || ((uint32_t)p == 0x2249)
                      ))))))))) ||
              ((((uint32_t)p == 0x2260 || ((uint32_t)p == 0x2262)) || ((uint32_t)p - 0x226d < 5))))
             || (((((uint32_t)p - 0x2274 < 3 || ((uint32_t)p - 0x2278 < 4)) ||
                  (((uint32_t)p - 0x2280 < 2 ||
                   ((((uint32_t)p - 0x2284 < 2 || ((uint32_t)p - 0x2288 < 2)) ||
                    ((uint32_t)p - 0x22ac < 4)))))) ||
                 (((uint32_t)p - 0x22e0 < 4 || ((uint32_t)p - 0x22ea < 4)))))) ||
            (((uint32_t)p == 0x1109a || (((uint32_t)p == 0x1109c || ((uint32_t)p == 0x110ab))))))))
        {
          local_64 = L'\x01';
        }
        wVar1 = unicode_to_utf16be(op16le,(uint32_t)p);
        op16le = op16le + wVar1;
        sVar2 = unicode_to_utf16le(pcStack_60,(uint32_t)p);
        pcStack_60 = pcStack_60 + sVar2;
        wVar1 = unicode_to_wc((wchar_t *)op16be,(uint32_t)p);
        op16be = op16be + (long)wVar1 * 4;
        wVar1 = unicode_to_utf8((char *)owp,(uint32_t)p);
        owp = (wchar_t *)((long)owp + (long)wVar1);
        if (*op == '\0') {
          *op16le = '\0';
          op16le[1] = '\0';
          *pcStack_60 = '\0';
          pcStack_60[1] = '\0';
          op16be[0] = '\0';
          op16be[1] = '\0';
          op16be[2] = '\0';
          op16be[3] = '\0';
          *(undefined1 *)owp = 0;
          return local_64;
        }
        p._0_4_ = 0;
      }
      else {
        p._0_4_ = (uint32_t)p * 0x10 + *op + -0x37;
      }
    }
    else {
      p._0_4_ = (uint32_t)p * 0x10 + *op + -0x30;
    }
    op = op + 1;
  } while( true );
}

Assistant:

static int
scan_unicode_pattern(char *out, wchar_t *wout, char *u16be, char *u16le,
    const char *pattern, int mac_nfd)
{
	unsigned uc = 0;
	const char *p = pattern;
	char *op = out;
	wchar_t *owp = wout;
	char *op16be = u16be;
	char *op16le = u16le;
	int ret = 0;

	for (;;) {
		if (*p >= '0' && *p <= '9')
			uc = (uc << 4) + (*p - '0');
		else if (*p >= 'A' && *p <= 'F')
			uc = (uc << 4) + (*p - 'A' + 0x0a);
		else {
			if (mac_nfd && op == out) {
				/*
				 * These are not converted to NFD on Mac OS.
 				 * U+2000 - U+2FFF
				 * U+F900 - U+FAFF
				 * U+2F800 - U+2FAFF
				 */
				switch (uc) {
				case 0x2194: case 0x219A: case 0x219B:
				case 0x21AE: case 0x21CD: case 0x21CE:
				case 0x21CF: case 0x2204: case 0x2209:
				case 0x220C: case 0x2224: case 0x2226:
				case 0x2241: case 0x2244: case 0x2247:
				case 0x2249: case 0x2260: case 0x2262:
				case 0x226D: case 0x226E: case 0x226F:
				case 0x2270: case 0x2271: case 0x2274:
				case 0x2275: case 0x2276: case 0x2278:
				case 0x2279: case 0x227A: case 0x227B:
				case 0x2280: case 0x2281: case 0x2284:
				case 0x2285: case 0x2288: case 0x2289:
				case 0x22AC: case 0x22AD: case 0x22AE:
				case 0x22AF: case 0x22E0: case 0x22E1:
				case 0x22E2: case 0x22E3: case 0x22EA:
				case 0x22EB: case 0x22EC: case 0x22ED:
				
				/*
				 * Those code points are not converted to
				 * NFD on Mac OS. I do not know the reason
				 * because it is undocumented.
				 *   NFC        NFD
				 *   1109A  ==> 11099 110BA
				 *   1109C  ==> 1109B 110BA
				 *   110AB  ==> 110A5 110BA
				 */
				case 0x1109A: case 0x1109C: case 0x110AB:
					ret = 1;
					break;
				}
			}
			op16be += unicode_to_utf16be(op16be, uc);
			op16le += unicode_to_utf16le(op16le, uc);
			owp += unicode_to_wc(owp, uc);
			op += unicode_to_utf8(op, uc);
			if (!*p) {
				*op16be++ = 0;
				*op16be = 0;
				*op16le++ = 0;
				*op16le = 0;
				*owp = L'\0';
				*op = '\0';
				break;
			}
			uc = 0;
		}
		p++;
	}
	return (ret);
}